

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float ImStb::STB_TEXTEDIT_GETWIDTH(ImGuiInputTextState *obj,int line_start_idx,int char_idx)

{
  unsigned_short *puVar1;
  float fVar2;
  
  puVar1 = ImVector<unsigned_short>::operator[](&obj->TextW,line_start_idx + char_idx);
  if (*puVar1 == 10) {
    fVar2 = -1.0;
  }
  else {
    fVar2 = ImFont::GetCharAdvance(GImGui->Font,*puVar1);
    fVar2 = (GImGui->FontSize / GImGui->Font->FontSize) * fVar2;
  }
  return fVar2;
}

Assistant:

static float   STB_TEXTEDIT_GETWIDTH(STB_TEXTEDIT_STRING* obj, int line_start_idx, int char_idx)  { ImWchar c = obj->TextW[line_start_idx+char_idx]; if (c == '\n') return STB_TEXTEDIT_GETWIDTH_NEWLINE; return GImGui->Font->GetCharAdvance(c) * (GImGui->FontSize / GImGui->Font->FontSize); }